

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenTupleExtract(BinaryenModuleRef module,BinaryenExpressionRef tuple,BinaryenIndex index)

{
  TupleExtract *this;
  
  this = (TupleExtract *)MixedArena::allocSpace(&module->allocator,0x20,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id = TupleExtractId;
  (this->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
  this->tuple = tuple;
  this->index = index;
  wasm::TupleExtract::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenTupleExtract(BinaryenModuleRef module,
                                           BinaryenExpressionRef tuple,
                                           BinaryenIndex index) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeTupleExtract((Expression*)tuple, index));
}